

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_refPrefix_advanced
                 (ZSTD_CCtx *cctx,void *prefix,size_t prefixSize,
                 ZSTD_dictContentType_e dictContentType)

{
  ZSTD_dictContentType_e in_ECX;
  size_t in_RDX;
  void *in_RSI;
  ZSTD_CCtx *in_RDI;
  size_t local_8;
  
  if (in_RDI->streamStage == zcss_init) {
    ZSTD_clearAllDicts(in_RDI);
    if ((in_RSI != (void *)0x0) && (in_RDX != 0)) {
      (in_RDI->prefixDict).dict = in_RSI;
      (in_RDI->prefixDict).dictSize = in_RDX;
      (in_RDI->prefixDict).dictContentType = in_ECX;
    }
    local_8 = 0;
  }
  else {
    local_8 = 0xffffffffffffffc4;
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtx_refPrefix_advanced(
        ZSTD_CCtx* cctx, const void* prefix, size_t prefixSize, ZSTD_dictContentType_e dictContentType)
{
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "Can't ref a prefix when ctx not in init stage.");
    ZSTD_clearAllDicts(cctx);
    if (prefix != NULL && prefixSize > 0) {
        cctx->prefixDict.dict = prefix;
        cctx->prefixDict.dictSize = prefixSize;
        cctx->prefixDict.dictContentType = dictContentType;
    }
    return 0;
}